

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_addr.cpp
# Opt level: O0

void __thiscall let::IpAddress::IpAddress(IpAddress *this,int port)

{
  uint16_t uVar1;
  allocator local_15;
  int local_14;
  IpAddress *pIStack_10;
  int port_local;
  IpAddress *this_local;
  
  local_14 = port;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"0.0.0.0",&local_15);
  std::allocator<char>::~allocator((allocator<char> *)&local_15);
  this->port_ = local_14;
  this->is_ipv6_ = false;
  (this->field_3).addr_.sin_family = 2;
  (this->field_3).addr6_.sin6_flowinfo = 0;
  uVar1 = htons((uint16_t)local_14);
  (this->field_3).addr_.sin_port = uVar1;
  return;
}

Assistant:

IpAddress::IpAddress(int port)
    : port_(port),
      ip_("0.0.0.0")
{
    addr_.sin_family = AF_INET;
    addr_.sin_addr.s_addr = INADDR_ANY;
    addr_.sin_port = htons(port);
}